

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall RealCommandRunner::WaitForCommand(RealCommandRunner *this,Result *result)

{
  Subprocess *pSVar1;
  bool bVar2;
  ExitStatus EVar3;
  Subprocess *this_00;
  iterator __position;
  Subprocess *local_28;
  
  do {
    this_00 = SubprocessSet::NextFinished(&this->subprocs_);
    if (this_00 != (Subprocess *)0x0) {
      local_28 = this_00;
      EVar3 = Subprocess::Finish(this_00);
      result->status = EVar3;
      Subprocess::GetOutput_abi_cxx11_(this_00);
      std::__cxx11::string::_M_assign((string *)&result->output);
      __position = std::
                   _Rb_tree<const_Subprocess_*,_std::pair<const_Subprocess_*const,_Edge_*>,_std::_Select1st<std::pair<const_Subprocess_*const,_Edge_*>_>,_std::less<const_Subprocess_*>,_std::allocator<std::pair<const_Subprocess_*const,_Edge_*>_>_>
                   ::find(&(this->subproc_to_edge_)._M_t,&local_28);
      result->edge = (Edge *)__position._M_node[1]._M_parent;
      std::
      _Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
      ::erase_abi_cxx11_((_Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
                          *)&this->subproc_to_edge_,__position);
      pSVar1 = local_28;
      if (local_28 != (Subprocess *)0x0) {
        Subprocess::~Subprocess(local_28);
      }
      operator_delete(pSVar1,0x30);
      break;
    }
    bVar2 = SubprocessSet::DoWork(&this->subprocs_);
  } while (!bVar2);
  return this_00 != (Subprocess *)0x0;
}

Assistant:

bool RealCommandRunner::WaitForCommand(Result* result) {
  Subprocess* subproc;
  while ((subproc = subprocs_.NextFinished()) == NULL) {
    bool interrupted = subprocs_.DoWork();
    if (interrupted)
      return false;
  }

  result->status = subproc->Finish();
  result->output = subproc->GetOutput();

  map<const Subprocess*, Edge*>::iterator e = subproc_to_edge_.find(subproc);
  result->edge = e->second;
  subproc_to_edge_.erase(e);

  delete subproc;
  return true;
}